

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O2

void parse_simple_label(parser *param_1,shared_data *sd,void *v,v_array<substring> *words)

{
  substring *psVar1;
  uint uVar2;
  ostream *poVar3;
  ulong uVar4;
  float fVar5;
  substring s;
  
  psVar1 = words->_begin;
  switch((long)words->_end - (long)psVar1 >> 4) {
  case 0:
    break;
  case 1:
    fVar5 = float_of_substring(*psVar1);
    *(float *)v = fVar5;
    break;
  case 2:
    fVar5 = float_of_substring(*psVar1);
    *(float *)v = fVar5;
    fVar5 = float_of_substring(words->_begin[1]);
    *(float *)((long)v + 4) = fVar5;
    break;
  case 3:
    fVar5 = float_of_substring(*psVar1);
    *(float *)v = fVar5;
    fVar5 = float_of_substring(words->_begin[1]);
    *(float *)((long)v + 4) = fVar5;
    fVar5 = float_of_substring(words->_begin[2]);
    *(float *)((long)v + 8) = fVar5;
    break;
  default:
    poVar3 = std::operator<<((ostream *)&std::cout,"Error: ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::operator<<(poVar3," is too many tokens for a simple label: ");
    uVar2 = 0;
    while( true ) {
      uVar4 = (ulong)uVar2;
      psVar1 = words->_begin;
      if ((ulong)((long)words->_end - (long)psVar1 >> 4) <= uVar4) break;
      s.end = psVar1[uVar4].end;
      s.begin = psVar1[uVar4].begin;
      print_substring(s);
      uVar2 = uVar2 + 1;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  }
  count_label(sd,*v);
  return;
}

Assistant:

void parse_simple_label(parser*, shared_data* sd, void* v, v_array<substring>& words)
{
  label_data* ld = (label_data*)v;

  switch (words.size())
  {
    case 0:
      break;
    case 1:
      ld->label = float_of_substring(words[0]);
      break;
    case 2:
      ld->label = float_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      break;
    case 3:
      ld->label = float_of_substring(words[0]);
      ld->weight = float_of_substring(words[1]);
      ld->initial = float_of_substring(words[2]);
      break;
    default:
      cout << "Error: " << words.size() << " is too many tokens for a simple label: ";
      for (unsigned int i = 0; i < words.size(); ++i) print_substring(words[i]);
      cout << endl;
  }
  count_label(sd, ld->label);
}